

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcMux.c
# Opt level: O3

Lpk_Fun_t * Lpk_MuxSplit(Lpk_Man_t *pMan,Lpk_Fun_t *p,int Var,int Pol)

{
  undefined1 *pIn;
  char *pOut;
  undefined1 auVar1 [16];
  uint uVar2;
  Lpk_Fun_t *p_00;
  byte bVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  char *pTruth;
  long lVar8;
  uint uVar9;
  char *pOut_00;
  uint uVar10;
  int iVar13;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  
  uVar2 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
  bVar3 = (sbyte)uVar2 - 5;
  if (uVar2 < 6) {
    bVar3 = 0;
  }
  if ((Var < 0) || (uVar2 <= (uint)Var)) {
    __assert_fail("Var >= 0 && Var < (int)p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                  ,0xac,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
  }
  if ((*(uint *)&p->field_0x8 & 0x3ffe0000) == 0) {
    __assert_fail("p->nAreaLim >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                  ,0xad,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
  }
  if ((-1 << (sbyte)uVar2 ^ p->uSupp) != 0xffffffff) {
    __assert_fail("p->uSupp == Kit_BitMask(p->nVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                  ,0xae,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
  }
  pIn = &p->field_0xe4;
  pOut_00 = p->pFanins + (ulong)(uint)(1 << (bVar3 & 0x1f)) * 4 + 0x10;
  pOut = p->pFanins + (ulong)(uint)(2 << (bVar3 & 0x1f)) * 4 + 0x10;
  Kit_TruthCofactor0New((uint *)pOut_00,(uint *)pIn,uVar2,Var);
  Kit_TruthCofactor1New((uint *)pOut,(uint *)pIn,*(uint *)&p->field_0x8 >> 7 & 0x1f,Var);
  pTruth = pOut;
  pcVar7 = pOut_00;
  if (Pol == 0) {
    pTruth = pOut_00;
    pcVar7 = pOut;
  }
  p_00 = Lpk_FunDup(p,(uint *)pcVar7);
  uVar2 = Kit_TruthSupport((uint *)pTruth,*(uint *)&p->field_0x8 >> 7 & 0x1f);
  uVar2 = uVar2 | 1 << (Var & 0x1fU);
  p->uSupp = uVar2;
  uVar4 = 0;
  do {
    if ((uVar2 >> (uVar4 & 0x1f) & 1) == 0) {
      uVar10 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
      if (uVar10 <= uVar4) {
        __assert_fail("iVarVac < (int)p->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                      ,0xc0,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
      }
      goto LAB_004e29e1;
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x20);
  uVar10 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
  uVar4 = 0xffffffff;
LAB_004e29e1:
  p->uSupp = uVar2 | 1 << (uVar4 & 0x1f);
  auVar1 = _DAT_0093d220;
  uVar2 = 1 << ((char)uVar10 - 5U & 0x1f);
  if (uVar10 < 6) {
    uVar2 = 1;
  }
  lVar8 = (long)(int)uVar4;
  if ((int)uVar4 < 5) {
    uVar4 = *(uint *)(&DAT_009dd9e0 + lVar8 * 4);
    lVar5 = (ulong)uVar2 - 1;
    auVar11._8_4_ = (int)lVar5;
    auVar11._0_8_ = lVar5;
    auVar11._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar6 = 0;
    auVar11 = auVar11 ^ _DAT_0093d220;
    auVar15 = _DAT_0093e4e0;
    auVar14 = _DAT_0093d210;
    do {
      auVar16 = auVar14 ^ auVar1;
      iVar13 = auVar11._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar13 && auVar11._0_4_ < auVar16._0_4_ ||
                  iVar13 < auVar16._4_4_) & 1)) {
        *(uint *)(p->pFanins + uVar6 * 4 + 0x10) = uVar4;
      }
      if ((auVar16._12_4_ != auVar11._12_4_ || auVar16._8_4_ <= auVar11._8_4_) &&
          auVar16._12_4_ <= auVar11._12_4_) {
        p[1].puSupps[uVar6 - 4] = uVar4;
      }
      iVar17 = SUB164(auVar15 ^ auVar1,4);
      if (iVar17 <= iVar13 && (iVar17 != iVar13 || SUB164(auVar15 ^ auVar1,0) <= auVar11._0_4_)) {
        p[1].puSupps[uVar6 - 3] = uVar4;
        p[1].puSupps[uVar6 - 2] = uVar4;
      }
      uVar6 = uVar6 + 4;
      lVar5 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar5 + 4;
      lVar5 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 4;
      auVar15._8_8_ = lVar5 + 4;
    } while ((uVar2 + 3 & 0xfffffffc) != uVar6);
  }
  else {
    uVar4 = 1 << ((char)uVar4 - 5U & 0x1f);
    lVar5 = (ulong)uVar2 - 1;
    auVar12._8_4_ = (int)lVar5;
    auVar12._0_8_ = lVar5;
    auVar12._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar6 = 0;
    auVar12 = auVar12 ^ _DAT_0093d220;
    auVar16 = _DAT_0093d210;
    do {
      auVar15 = auVar16 ^ auVar1;
      if ((bool)(~(auVar15._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar15._0_4_ ||
                  auVar12._4_4_ < auVar15._4_4_) & 1)) {
        *(uint *)(p->pFanins + uVar6 * 4 + 0x10) = -(uint)((uVar4 & (uint)uVar6) != 0);
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        p[1].puSupps[uVar6 - 4] = -(uint)(((uint)uVar6 + 1 & uVar4) != 0);
      }
      uVar6 = uVar6 + 2;
      lVar5 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 2;
      auVar16._8_8_ = lVar5 + 2;
    } while ((uVar2 + 1 & 0xfffffffe) != uVar6);
  }
  pcVar7 = pIn;
  if (Pol != 0) {
    pcVar7 = pOut;
    pOut_00 = pIn;
  }
  Kit_TruthMuxVar((uint *)pIn,(uint *)pOut_00,(uint *)pcVar7,uVar10,Var);
  uVar2 = p->uSupp;
  uVar4 = Kit_TruthSupport((uint *)pIn,*(uint *)&p->field_0x8 >> 7 & 0x1f);
  if (uVar2 == uVar4) {
    p->pFanins[lVar8] = p_00->field_0x8 & 0x7f;
    p->pDelays[lVar8] = p->nDelayLim - 1;
    p->field_0xb = p->field_0xb & 0xbf;
    Lpk_FunSuppMinimize(p);
    Lpk_FunSuppMinimize(p_00);
    p_00->nDelayLim = p->nDelayLim - 1;
    uVar2 = *(uint *)&p_00->field_0x8;
    uVar4 = uVar2 >> 7 & 0x1f;
    if ((uVar2 >> 0xc & 0xf) < uVar4) {
      uVar10 = *(uint *)&p->field_0x8;
      uVar9 = uVar10 >> 7 & 0x1f;
      if ((uVar10 >> 0xc & 0xf) < uVar9) {
        if (uVar9 < uVar4) {
          *(uint *)&p_00->field_0x8 =
               uVar2 & 0xc000ffff | (uVar10 & 0x10000) + (uVar10 >> 1 & 0x1fff0000);
          uVar4 = *(uint *)&p->field_0x8;
          uVar2 = (((int)(uVar4 << 0xf) >> 0x1f) + (uVar4 >> 0x11 & 0x1fff) & 0x3fff) << 0x10;
        }
        else {
          *(uint *)&p_00->field_0x8 =
               uVar2 & 0xc000ffff |
               (((int)(uVar10 << 0xf) >> 0x1f) + (uVar10 >> 0x11 & 0x1fff) & 0x3fff) << 0x10;
          uVar4 = *(uint *)&p->field_0x8;
          uVar2 = (uVar4 & 0x10000) + (uVar4 >> 1 & 0x1fff0000);
        }
        uVar2 = uVar4 & 0xc000ffff | uVar2;
      }
      else {
        *(uint *)&p_00->field_0x8 = uVar2 & 0xc000ffff | uVar10 + 0x3fff0000 & 0x3fff0000;
        uVar2 = *(uint *)&p->field_0x8 & 0xc000ffff | 0x10000;
      }
    }
    else {
      *(uint *)&p_00->field_0x8 = uVar2 & 0xc000ffff | 0x10000;
      uVar2 = *(uint *)&p->field_0x8 & 0xc000ffff | *(uint *)&p->field_0x8 + 0x3fff0000 & 0x3fff0000
      ;
    }
    *(uint *)&p->field_0x8 = uVar2;
    p_00->field_0xb = p_00->field_0xb | 0x80;
    return p_00;
  }
  __assert_fail("p->uSupp == Kit_TruthSupport(pTruth, p->nVars)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                ,199,"Lpk_Fun_t *Lpk_MuxSplit(Lpk_Man_t *, Lpk_Fun_t *, int, int)");
}

Assistant:

Lpk_Fun_t * Lpk_MuxSplit( Lpk_Man_t * pMan, Lpk_Fun_t * p, int Var, int Pol )
{
    Lpk_Fun_t * pNew;
    unsigned * pTruth  = Lpk_FunTruth( p, 0 );
    unsigned * pTruth0 = Lpk_FunTruth( p, 1 );
    unsigned * pTruth1 = Lpk_FunTruth( p, 2 );
//    unsigned uSupp;
    int iVarVac; 
    assert( Var >= 0 && Var < (int)p->nVars );
    assert( p->nAreaLim >= 2 );
    assert( p->uSupp == Kit_BitMask(p->nVars) );
    Kit_TruthCofactor0New( pTruth0, pTruth, p->nVars, Var );
    Kit_TruthCofactor1New( pTruth1, pTruth, p->nVars, Var );
/*
uSupp = Kit_TruthSupport( pTruth, p->nVars );
Extra_PrintBinary( stdout, &uSupp, 16 ); printf( "\n" );
uSupp = Kit_TruthSupport( pTruth0, p->nVars );
Extra_PrintBinary( stdout, &uSupp, 16 ); printf( "\n" );
uSupp = Kit_TruthSupport( pTruth1, p->nVars );
Extra_PrintBinary( stdout, &uSupp, 16 ); printf( "\n\n" );
*/
    // derive the new component
    pNew = Lpk_FunDup( p, Pol ? pTruth0 : pTruth1 );
    // update the support of the old component
    p->uSupp  = Kit_TruthSupport( Pol ? pTruth1 : pTruth0, p->nVars );
    p->uSupp |= (1 << Var);
    // update the truth table of the old component
    iVarVac = Kit_WordFindFirstBit( ~p->uSupp );
    assert( iVarVac < (int)p->nVars );
    p->uSupp |= (1 << iVarVac);
    Kit_TruthIthVar( pTruth, p->nVars, iVarVac );
    if ( Pol )
        Kit_TruthMuxVar( pTruth, pTruth, pTruth1, p->nVars, Var );
    else
        Kit_TruthMuxVar( pTruth, pTruth0, pTruth, p->nVars, Var );
    assert( p->uSupp == Kit_TruthSupport(pTruth, p->nVars) );
    // set the decomposed variable
    p->pFanins[iVarVac] = pNew->Id;
    p->pDelays[iVarVac] = p->nDelayLim - 1;
    // support minimize both
    p->fSupports = 0;
    Lpk_FunSuppMinimize( p );
    Lpk_FunSuppMinimize( pNew );
    // update delay and area requirements
    pNew->nDelayLim = p->nDelayLim - 1;
    if ( pNew->nVars <= pNew->nLutK )
    {
        pNew->nAreaLim = 1;
        p->nAreaLim = p->nAreaLim - 1;
    }
    else if ( p->nVars <= p->nLutK )
    {
        pNew->nAreaLim = p->nAreaLim - 1;
        p->nAreaLim = 1;
    }
    else if ( p->nVars < pNew->nVars )
    {
        pNew->nAreaLim = p->nAreaLim / 2 + p->nAreaLim % 2;
        p->nAreaLim = p->nAreaLim / 2 - p->nAreaLim % 2;
    }
    else // if ( pNew->nVars < p->nVars )
    {
        pNew->nAreaLim = p->nAreaLim / 2 - p->nAreaLim % 2;
        p->nAreaLim = p->nAreaLim / 2 + p->nAreaLim % 2;
    }
    pNew->fMark = 1;
    return pNew;
}